

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_D
          (ChElementHexaANCF_3843 *this,MatrixNx3c *Sxi_D,double xi,double eta,double zeta)

{
  VectorN Sxi_D_col;
  VectorN local_180;
  
  Calc_Sxi_xi_compact(this,&local_180,xi,eta,zeta);
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[0]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[0];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[1]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[1];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[2]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[2];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[3]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[3];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[4]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[4];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[5]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[5];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[6]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[6];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[7]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[7];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[8]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[8];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[9]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[9];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array[10]
       = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[10];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0xb] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
          array[0xb];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0xc] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
          array[0xc];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0xd] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
          array[0xd];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0xe] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
          array[0xe];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0xf] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
          array[0xf];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x10] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x10];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x11] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x11];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x12] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x12];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x13] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x13];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x14] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x14];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x15] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x15];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x16] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x16];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x17] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x17];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x18] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x18];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x19] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x19];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x1a] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1a];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x1b] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1b];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x1c] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1c];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x1d] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1d];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x1e] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1e];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x1f] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1f];
  Calc_Sxi_eta_compact(this,&local_180,xi,eta,zeta);
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x20] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x21] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[1];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x22] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[2];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x23] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[3];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x24] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[4];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x25] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[5];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x26] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[6];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x27] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[7];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x28] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[8];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x29] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[9];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x2a] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[10];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x2b] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xb];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x2c] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xc];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x2d] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xd];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x2e] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xe];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x2f] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xf];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x30] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x10];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x31] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x11];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x32] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x12];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x33] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x13];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x34] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x14];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x35] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x15];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x36] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x16];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x37] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x17];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x38] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x18];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x39] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x19];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x3a] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1a];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x3b] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1b];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x3c] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1c];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x3d] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1d];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x3e] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1e];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x3f] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1f];
  Calc_Sxi_zeta_compact(this,&local_180,xi,eta,zeta);
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x40] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x41] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[1];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x42] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[2];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x43] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[3];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x44] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[4];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x45] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[5];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x46] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[6];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x47] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[7];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x48] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[8];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x49] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[9];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x4a] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[10];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x4b] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xb];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x4c] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xc];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x4d] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xd];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x4e] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xe];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x4f] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0xf];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x50] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x10];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x51] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x11];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x52] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x12];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x53] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x13];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x54] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x14];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x55] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x15];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x56] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x16];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x57] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x17];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x58] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x18];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x59] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x19];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x5a] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1a];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x5b] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1b];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x5c] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1c];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x5d] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1d];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x5e] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1e];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).m_storage.m_data.array
  [0x5f] = local_180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
           .array[0x1f];
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_D(MatrixNx3c& Sxi_D, double xi, double eta, double zeta) {
    VectorN Sxi_D_col;
    Calc_Sxi_xi_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(0) = Sxi_D_col;

    Calc_Sxi_eta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(1) = Sxi_D_col;

    Calc_Sxi_zeta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(2) = Sxi_D_col;
}